

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O0

ScenarioLowerBound * __thiscall
despot::RegDemo::CreateScenarioLowerBound(RegDemo *this,string *name,string *particle_bound_name)

{
  StatePolicy *pSVar1;
  StatePolicy *pSVar2;
  StateIndexer *pSVar3;
  bool bVar4;
  RegDemo *pRVar5;
  ParticleLowerBound *pPVar6;
  ostream *poVar7;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98;
  undefined1 local_71;
  string local_70 [48];
  StatePolicy *local_40;
  StatePolicy *policy;
  StateIndexer *indexer;
  DSPOMDP *model;
  string *particle_bound_name_local;
  string *name_local;
  RegDemo *this_local;
  
  policy = (StatePolicy *)&this->super_StateIndexer;
  local_40 = &this->super_StatePolicy;
  indexer = (StateIndexer *)this;
  model = (DSPOMDP *)particle_bound_name;
  particle_bound_name_local = name;
  name_local = (string *)this;
  bVar4 = std::operator==(name,"TRIVIAL");
  if (bVar4) {
    pRVar5 = (RegDemo *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound
              ((TrivialParticleLowerBound *)pRVar5,(DSPOMDP *)indexer);
    this_local = pRVar5;
  }
  else {
    bVar4 = std::operator==(name,"RANDOM");
    if (bVar4) {
      pRVar5 = (RegDemo *)operator_new(0x38);
      pSVar3 = indexer;
      local_71 = 1;
      std::__cxx11::string::string(local_70,(string *)particle_bound_name);
      pPVar6 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_70);
      despot::RandomPolicy::RandomPolicy((RandomPolicy *)pRVar5,(DSPOMDP *)pSVar3,pPVar6);
      local_71 = 0;
      this_local = pRVar5;
      std::__cxx11::string::~string(local_70);
    }
    else {
      bVar4 = std::operator==(name,"MODE");
      if ((!bVar4) && (bVar4 = std::operator==(name,"DEFAULT"), !bVar4)) {
        bVar4 = std::operator==(name,"MAJORITY");
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"MDP",&local_e9);
          ComputeDefaultActions(this,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator(&local_e9);
          pRVar5 = (RegDemo *)operator_new(0x28);
          pSVar3 = indexer;
          pSVar1 = local_40;
          std::__cxx11::string::string(local_110,(string *)particle_bound_name);
          pPVar6 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_110);
          despot::MajorityActionPolicy::MajorityActionPolicy
                    ((MajorityActionPolicy *)pRVar5,(DSPOMDP *)pSVar3,pSVar1,pPVar6);
          this_local = pRVar5;
          std::__cxx11::string::~string(local_110);
          return (ScenarioLowerBound *)this_local;
        }
        poVar7 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario lower bound: ");
        poVar7 = std::operator<<(poVar7,(string *)name);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        exit(-1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"MDP",&local_99);
      ComputeDefaultActions(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      pRVar5 = (RegDemo *)operator_new(0x48);
      pSVar3 = indexer;
      pSVar2 = policy;
      pSVar1 = local_40;
      local_c1 = 1;
      std::__cxx11::string::string(local_c0,(string *)particle_bound_name);
      pPVar6 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_c0);
      despot::ModeStatePolicy::ModeStatePolicy
                ((ModeStatePolicy *)pRVar5,(DSPOMDP *)pSVar3,(StateIndexer *)pSVar2,pSVar1,pPVar6);
      local_c1 = 0;
      this_local = pRVar5;
      std::__cxx11::string::~string(local_c0);
    }
  }
  return (ScenarioLowerBound *)this_local;
}

Assistant:

ScenarioLowerBound* RegDemo::CreateScenarioLowerBound(string name,
	string particle_bound_name) const {
	const DSPOMDP* model = this;
	const StateIndexer* indexer = this;
	const StatePolicy* policy = this;
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(model);
	} else if (name == "RANDOM") {
		return new RandomPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE" || name == "DEFAULT") {
		ComputeDefaultActions("MDP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY") {
		// ComputeDefaultActions(Globals::config.default_action);
		ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		cerr << "Unsupported scenario lower bound: " << name << endl;
		exit(-1);
		return NULL;
	}
}